

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void prvTidyAddStringLiteral(Lexer *lexer,ctmbstr str)

{
  ctmbstr ptStack_18;
  byte c;
  ctmbstr str_local;
  Lexer *lexer_local;
  
  ptStack_18 = str;
  while( true ) {
    if (*ptStack_18 == '\0') break;
    AddByte(lexer,*ptStack_18);
    ptStack_18 = ptStack_18 + 1;
  }
  return;
}

Assistant:

void TY_(AddStringLiteral)( Lexer* lexer, ctmbstr str )
{
    byte c;
    while(0 != (c = *str++) ) {
        /*\
         *  Issue #286
         *  Previously this used TY_(AddCharToLexer)( lexer, c );
         *  which uses err = TY_(EncodeCharToUTF8Bytes)( c, buf, NULL, &count );
         *  But this is transferring already 'translated' data from an
         *  internal location to the lexer, so should use AddByte()
        \*/
        AddByte( lexer, c );
    }
}